

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numparse_affixes.cpp
# Opt level: O3

void __thiscall
icu_63::numparse::impl::AffixMatcherWarehouse::AffixMatcherWarehouse
          (AffixMatcherWarehouse *this,AffixTokenMatcherWarehouse *tokenWarehouse)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  AffixMatcher *pAVar3;
  long lVar4;
  ArraySeriesMatcher *this_00;
  undefined1 auVar5 [16];
  
  auVar2 = _DAT_00314c80;
  auVar1 = _DAT_00314c70;
  pAVar3 = this->fAffixMatchers + 1;
  lVar4 = 0;
  do {
    auVar5._8_4_ = (int)lVar4;
    auVar5._0_8_ = lVar4;
    auVar5._12_4_ = (int)((ulong)lVar4 >> 0x20);
    auVar5 = (auVar5 | auVar1) ^ auVar2;
    if (auVar5._4_4_ == -0x80000000 && auVar5._0_4_ < -0x7ffffff7) {
      ((AffixMatcherWarehouse *)(pAVar3 + -1))->fAffixMatchers[0].super_NumberParseMatcher.
      _vptr_NumberParseMatcher = (_func_int **)&PTR__NumberParseMatcher_003d8de8;
      (pAVar3->super_NumberParseMatcher)._vptr_NumberParseMatcher =
           (_func_int **)&PTR__NumberParseMatcher_003d8de8;
    }
    lVar4 = lVar4 + 2;
    pAVar3 = pAVar3 + 2;
  } while (lVar4 != 10);
  this_00 = &this->fAffixPatternMatchers[0].super_ArraySeriesMatcher;
  lVar4 = 0;
  do {
    ArraySeriesMatcher::ArraySeriesMatcher(this_00);
    (this_00->super_SeriesMatcher).super_CompositionMatcher.super_NumberParseMatcher.
    _vptr_NumberParseMatcher = (_func_int **)&PTR__AffixPatternMatcher_003d7db0;
    this_00[1].super_SeriesMatcher.super_CompositionMatcher.super_NumberParseMatcher.
    _vptr_NumberParseMatcher = (_func_int **)((long)&this_00[1].fMatchers.ptr + 6);
    *(undefined4 *)&this_00[1].fMatchers.ptr = 4;
    *(undefined1 *)((long)&this_00[1].fMatchers.ptr + 4) = 0;
    *(undefined2 *)((long)&this_00[1].fMatchers.ptr + 6) = 0;
    lVar4 = lVar4 + -0x50;
    this_00 = (ArraySeriesMatcher *)this_00[1].fMatchers.stackArray;
  } while (lVar4 != -0x1e0);
  this->fTokenWarehouse = tokenWarehouse;
  return;
}

Assistant:

AffixMatcherWarehouse::AffixMatcherWarehouse(AffixTokenMatcherWarehouse* tokenWarehouse)
        : fTokenWarehouse(tokenWarehouse) {
}